

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O0

InteractionReadySeat interactor_announce(Interactor *itr)

{
  _Bool _Var1;
  Interactor *pIVar2;
  char *ptr;
  char *msg_00;
  bool bVar3;
  char *local_68;
  char *local_60;
  char *msg;
  char *adjective;
  char *desc;
  char *prefix;
  _Bool need_announcement;
  Interactor *itr_top;
  Interactor *pIStack_20;
  uint level;
  Seat *seat;
  Interactor *itr_local;
  InteractionReadySeat iseat;
  
  seat = (Seat *)itr;
  pIStack_20 = (Interactor *)interactor_get_seat(itr);
  _Var1 = is_tempseat((Seat *)pIStack_20);
  if (_Var1) {
    __assert_fail("!is_tempseat(seat) && \"Shouldn\'t call announce when someone else is using our seat\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/interactor.c"
                  ,0x4f,"InteractionReadySeat interactor_announce(Interactor *)");
  }
  itr_local = pIStack_20;
  pIVar2 = interactor_toplevel((Interactor *)seat,(uint *)((long)&itr_top + 4));
  bVar3 = pIVar2->last_to_talk != (Interactor *)seat;
  if ((seat[1].vt == (SeatVtable *)0x0) && (pIVar2->last_to_talk == (Interactor *)0x0)) {
    bVar3 = false;
  }
  if (bVar3) {
    if (pIVar2->last_to_talk != (Interactor *)0x0) {
      seat_antispoof_msg((InteractionReadySeat)itr_local,anon_var_dwarf_248df + 10);
    }
    ptr = interactor_description((Interactor *)seat);
    if (itr_top._4_4_ == 0) {
      local_60 = dupstr("primary");
    }
    else {
      if (itr_top._4_4_ == 1) {
        local_68 = dupstr("proxy");
      }
      else {
        local_68 = dupprintf("proxy^%u",(ulong)itr_top._4_4_);
      }
      local_60 = local_68;
    }
    msg_00 = dupprintf("%sMaking %s %s",anon_var_dwarf_248df + 10,local_60,ptr);
    safefree(local_60);
    safefree(ptr);
    seat_antispoof_msg((InteractionReadySeat)itr_local,msg_00);
    safefree(msg_00);
    pIVar2->last_to_talk = (Interactor *)seat;
  }
  return (InteractionReadySeat)(Seat *)itr_local;
}

Assistant:

InteractionReadySeat interactor_announce(Interactor *itr)
{
    Seat *seat = interactor_get_seat(itr);
    assert(!is_tempseat(seat) &&
           "Shouldn't call announce when someone else is using our seat");

    InteractionReadySeat iseat;
    iseat.seat = seat;

    unsigned level;
    Interactor *itr_top = interactor_toplevel(itr, &level);

    /*
     * Generally, we should announce ourself if the previous
     * Interactor that said anything was not us. That includes if
     * there was no previous Interactor to talk (i.e. if we're the
     * first to say anything) - *except* that the primary Interactor
     * doesn't need to announce itself, if no proxy has intervened
     * before it.
     */
    bool need_announcement = (itr_top->last_to_talk != itr);
    if (!itr->parent && !itr_top->last_to_talk)
        need_announcement = false;

    if (need_announcement) {
        const char *prefix = "";
        if (itr_top->last_to_talk != NULL)
            seat_antispoof_msg(iseat, ""); /* leave a separating blank line */

        char *desc = interactor_description(itr);
        char *adjective = (level == 0 ? dupstr("primary") :
                           level == 1 ? dupstr("proxy") :
                           dupprintf("proxy^%u", level));
        char *msg = dupprintf("%sMaking %s %s", prefix, adjective, desc);
        sfree(adjective);
        sfree(desc);

        seat_antispoof_msg(iseat, msg);
        sfree(msg);

        itr_top->last_to_talk = itr;
    }

    return iseat;
}